

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emap.c
# Opt level: O1

_Bool emap_rtree_leaf_elms_lookup
                (tsdn_t *tsdn,emap_t *emap,rtree_ctx_t *rtree_ctx,edata_t *edata,_Bool dependent,
                _Bool init_missing,rtree_leaf_elm_t **r_elm_a,rtree_leaf_elm_t **r_elm_b)

{
  rtree_ctx_cache_elm_t *prVar1;
  void *pvVar2;
  rtree_leaf_elm_t *prVar3;
  ulong uVar4;
  ulong uVar5;
  ulong key;
  rtree_leaf_elm_t *prVar6;
  uintptr_t key_00;
  ulong *puVar7;
  void *pvVar8;
  _Bool _Var9;
  ulong uVar10;
  ulong uVar11;
  rtree_ctx_cache_elm_t *prVar12;
  rtree_ctx_cache_elm_t *prVar13;
  bool bVar14;
  rtree_leaf_elm_t *local_38;
  
  pvVar2 = edata->e_addr;
  key = (ulong)pvVar2 & 0xfffffffffffff000;
  uVar5 = (ulong)pvVar2 & 0xffffffffc0000000;
  uVar10 = (ulong)(((uint)((ulong)pvVar2 >> 0x1e) & 0xf) << 4);
  puVar7 = (ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar10);
  uVar10 = *(ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar10);
  if (uVar10 == uVar5) {
    prVar6 = (rtree_leaf_elm_t *)((ulong)((uint)(key >> 9) & 0x1ffff8) + puVar7[1]);
  }
  else if (rtree_ctx->l2_cache[0].leafkey == uVar5) {
    prVar6 = rtree_ctx->l2_cache[0].leaf;
    rtree_ctx->l2_cache[0].leafkey = uVar10;
    rtree_ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar7[1];
    *puVar7 = uVar5;
    puVar7[1] = (ulong)prVar6;
    prVar6 = (rtree_leaf_elm_t *)
             ((long)&(prVar6->le_bits).repr + (ulong)((uint)key >> 9 & 0x1ffff8));
  }
  else {
    prVar12 = rtree_ctx->l2_cache + 1;
    if (rtree_ctx->l2_cache[1].leafkey == uVar5) {
      uVar11 = 0;
      local_38 = (rtree_leaf_elm_t *)0x0;
    }
    else {
      uVar4 = 1;
      prVar13 = prVar12;
      do {
        uVar11 = uVar4;
        if (uVar11 == 7) {
          prVar6 = (rtree_leaf_elm_t *)CONCAT71((int7)(uVar5 >> 8),6 < uVar11);
          local_38 = prVar6;
          goto LAB_01dac3b4;
        }
        prVar12 = prVar13 + 1;
        prVar1 = prVar13 + 1;
        uVar4 = uVar11 + 1;
        prVar13 = prVar12;
      } while (prVar1->leafkey != uVar5);
      local_38 = (rtree_leaf_elm_t *)(ulong)(6 < uVar11);
    }
    prVar6 = prVar12->leaf;
    prVar12->leafkey = rtree_ctx->l2_cache[uVar11].leafkey;
    prVar12->leaf = rtree_ctx->l2_cache[uVar11].leaf;
    rtree_ctx->l2_cache[uVar11].leafkey = uVar10;
    rtree_ctx->l2_cache[uVar11].leaf = (rtree_leaf_elm_t *)puVar7[1];
    *puVar7 = uVar5;
    puVar7[1] = (ulong)prVar6;
    prVar6 = (rtree_leaf_elm_t *)
             ((long)&(prVar6->le_bits).repr +
             (ulong)((uint)(((ulong)pvVar2 & 0xfffff000) >> 9) & 0x1ffff8));
LAB_01dac3b4:
    if ((char)local_38 != '\0') {
      prVar6 = duckdb_je_rtree_leaf_elm_lookup_hard
                         (tsdn,&emap->rtree,rtree_ctx,key,dependent,init_missing);
    }
  }
  *r_elm_a = prVar6;
  if ((dependent) || (_Var9 = true, prVar6 != (rtree_leaf_elm_t *)0x0)) {
    key_00 = (((edata->field_2).e_size_esn & 0xfffffffffffff000) +
             ((ulong)edata->e_addr & 0xfffffffffffff000)) - 0x1000;
    pvVar8 = (void *)(key_00 & 0xffffffffc0000000);
    uVar10 = (ulong)(((uint)(key_00 >> 0x1e) & 0xf) << 4);
    prVar6 = (rtree_leaf_elm_t *)((long)&rtree_ctx->cache[0].leafkey + uVar10);
    pvVar2 = *(void **)((long)&rtree_ctx->cache[0].leafkey + uVar10);
    if (pvVar2 == pvVar8) {
      prVar6 = (rtree_leaf_elm_t *)
               ((ulong)((uint)(key_00 >> 9) & 0x1ffff8) + (long)prVar6[1].le_bits.repr);
    }
    else if ((void *)rtree_ctx->l2_cache[0].leafkey == pvVar8) {
      prVar3 = rtree_ctx->l2_cache[0].leaf;
      rtree_ctx->l2_cache[0].leafkey = (uintptr_t)pvVar2;
      rtree_ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)prVar6[1].le_bits.repr;
      (prVar6->le_bits).repr = pvVar8;
      prVar6[1].le_bits.repr = prVar3;
      prVar6 = (rtree_leaf_elm_t *)
               ((long)&(prVar3->le_bits).repr + (ulong)((uint)key_00 >> 9 & 0x1ffff8));
    }
    else {
      prVar12 = rtree_ctx->l2_cache + 1;
      if ((void *)rtree_ctx->l2_cache[1].leafkey == pvVar8) {
        uVar5 = 0;
        bVar14 = false;
      }
      else {
        uVar10 = 1;
        prVar13 = prVar12;
        do {
          uVar5 = uVar10;
          bVar14 = 6 < uVar5;
          if (uVar5 == 7) goto LAB_01dac444;
          prVar12 = prVar13 + 1;
          prVar1 = prVar13 + 1;
          uVar10 = uVar5 + 1;
          prVar13 = prVar12;
        } while ((void *)prVar1->leafkey != pvVar8);
        bVar14 = 6 < uVar5;
      }
      prVar3 = prVar12->leaf;
      prVar12->leafkey = rtree_ctx->l2_cache[uVar5].leafkey;
      prVar12->leaf = rtree_ctx->l2_cache[uVar5].leaf;
      rtree_ctx->l2_cache[uVar5].leafkey = (uintptr_t)pvVar2;
      rtree_ctx->l2_cache[uVar5].leaf = (rtree_leaf_elm_t *)prVar6[1].le_bits.repr;
      (prVar6->le_bits).repr = pvVar8;
      prVar6[1].le_bits.repr = prVar3;
      prVar6 = (rtree_leaf_elm_t *)
               ((long)&(prVar3->le_bits).repr + (ulong)((uint)(key_00 >> 9) & 0x1ffff8));
LAB_01dac444:
      if (bVar14) {
        prVar6 = duckdb_je_rtree_leaf_elm_lookup_hard
                           (tsdn,&emap->rtree,rtree_ctx,key_00,dependent,init_missing);
      }
    }
    *r_elm_b = prVar6;
    _Var9 = !dependent && prVar6 == (rtree_leaf_elm_t *)0x0;
  }
  return _Var9;
}

Assistant:

static bool
emap_rtree_leaf_elms_lookup(tsdn_t *tsdn, emap_t *emap, rtree_ctx_t *rtree_ctx,
    const edata_t *edata, bool dependent, bool init_missing,
    rtree_leaf_elm_t **r_elm_a, rtree_leaf_elm_t **r_elm_b) {
	*r_elm_a = rtree_leaf_elm_lookup(tsdn, &emap->rtree, rtree_ctx,
	    (uintptr_t)edata_base_get(edata), dependent, init_missing);
	if (!dependent && *r_elm_a == NULL) {
		return true;
	}
	assert(*r_elm_a != NULL);

	*r_elm_b = rtree_leaf_elm_lookup(tsdn, &emap->rtree, rtree_ctx,
	    (uintptr_t)edata_last_get(edata), dependent, init_missing);
	if (!dependent && *r_elm_b == NULL) {
		return true;
	}
	assert(*r_elm_b != NULL);

	return false;
}